

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hopUtil.c
# Opt level: O1

void Hop_ObjPrintEqn(FILE *pFile,Hop_Obj_t *pObj,Vec_Vec_t *vLevels,int Level)

{
  Vec_Ptr_t *vSuper;
  uint uVar1;
  int Level_00;
  void **ppvVar2;
  undefined8 *puVar3;
  int iVar4;
  char *pcVar5;
  long lVar6;
  Hop_Obj_t *pRoot;
  
  pRoot = (Hop_Obj_t *)((ulong)pObj & 0xfffffffffffffffe);
  uVar1 = *(uint *)&pRoot->field_0x20 & 7;
  if (uVar1 == 2) {
    pcVar5 = "!";
    if (((ulong)pObj & 1) == 0) {
      pcVar5 = "";
    }
    fprintf((FILE *)pFile,"%s%s",pcVar5,(pRoot->field_0).pData);
    return;
  }
  if (uVar1 == 1) {
    fprintf((FILE *)pFile,"%d",(ulong)((uint)pObj & 1 ^ 1));
    return;
  }
  Level_00 = Level + 1;
  if (vLevels->nSize <= Level) {
    if (vLevels->nCap <= Level) {
      if (vLevels->pArray == (void **)0x0) {
        ppvVar2 = (void **)malloc((long)Level_00 << 3);
      }
      else {
        ppvVar2 = (void **)realloc(vLevels->pArray,(long)Level_00 << 3);
      }
      vLevels->pArray = ppvVar2;
      vLevels->nCap = Level_00;
    }
    iVar4 = vLevels->nSize;
    lVar6 = (long)iVar4;
    if (iVar4 <= Level) {
      iVar4 = (Level - iVar4) + 1;
      do {
        puVar3 = (undefined8 *)malloc(0x10);
        *puVar3 = 0;
        puVar3[1] = 0;
        vLevels->pArray[lVar6] = puVar3;
        lVar6 = lVar6 + 1;
        iVar4 = iVar4 + -1;
      } while (iVar4 != 0);
    }
    vLevels->nSize = Level_00;
  }
  if ((-1 < Level) && (Level < vLevels->nSize)) {
    vSuper = (Vec_Ptr_t *)vLevels->pArray[(uint)Level];
    Hop_ObjCollectMulti(pRoot,vSuper);
    pcVar5 = "(";
    if (Level == 0) {
      pcVar5 = "";
    }
    fputs(pcVar5,(FILE *)pFile);
    if (0 < vSuper->nSize) {
      pcVar5 = "+";
      if (((ulong)pObj & 1) == 0) {
        pcVar5 = "*";
      }
      lVar6 = 0;
      do {
        Hop_ObjPrintEqn(pFile,(Hop_Obj_t *)((ulong)vSuper->pArray[lVar6] ^ (ulong)((uint)pObj & 1)),
                        vLevels,Level_00);
        if (lVar6 < (long)vSuper->nSize + -1) {
          fprintf((FILE *)pFile," %s ",pcVar5);
        }
        lVar6 = lVar6 + 1;
      } while (lVar6 < vSuper->nSize);
    }
    pcVar5 = ")";
    if (Level == 0) {
      pcVar5 = "";
    }
    fputs(pcVar5,(FILE *)pFile);
    return;
  }
  __assert_fail("i >= 0 && i < p->nSize",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecVec.h"
                ,0x111,"Vec_Ptr_t *Vec_VecEntry(Vec_Vec_t *, int)");
}

Assistant:

void Hop_ObjPrintEqn( FILE * pFile, Hop_Obj_t * pObj, Vec_Vec_t * vLevels, int Level )
{
    Vec_Ptr_t * vSuper;
    Hop_Obj_t * pFanin;
    int fCompl, i;
    // store the complemented attribute
    fCompl = Hop_IsComplement(pObj);
    pObj = Hop_Regular(pObj);
    // constant case
    if ( Hop_ObjIsConst1(pObj) )
    {
        fprintf( pFile, "%d", !fCompl );
        return;
    }
    // PI case
    if ( Hop_ObjIsPi(pObj) )
    {
        fprintf( pFile, "%s%s", fCompl? "!" : "", (char*)pObj->pData );
        return;
    }
    // AND case
    Vec_VecExpand( vLevels, Level );
    vSuper = Vec_VecEntry(vLevels, Level);
    Hop_ObjCollectMulti( pObj, vSuper );
    fprintf( pFile, "%s", (Level==0? "" : "(") );
    Vec_PtrForEachEntry( Hop_Obj_t *, vSuper, pFanin, i )
    {
        Hop_ObjPrintEqn( pFile, Hop_NotCond(pFanin, fCompl), vLevels, Level+1 );
        if ( i < Vec_PtrSize(vSuper) - 1 )
            fprintf( pFile, " %s ", fCompl? "+" : "*" );
    }
    fprintf( pFile, "%s", (Level==0? "" : ")") );
    return;
}